

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

uint32 __thiscall Js::JavascriptStackWalker::GetByteCodeOffset(JavascriptStackWalker *this)

{
  uint uVar1;
  uint32 local_c [2];
  uint32 offset;
  
  local_c[0] = 0;
  if (((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) == 0) {
    if (((ByteCodeReader *)this->interpreterFrame == (ByteCodeReader *)0x0) ||
       ((this->lastInternalFrameInfo).codeAddress != (void *)0x0)) {
      TryGetByteCodeOffsetFromNativeFrame(this,local_c);
    }
    else {
      uVar1 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this->interpreterFrame);
      local_c[0] = uVar1 - 1;
      if (uVar1 == 0) {
        local_c[0] = 0;
      }
    }
  }
  return local_c[0];
}

Assistant:

uint32 JavascriptStackWalker::GetByteCodeOffset() const
    {
        uint32 offset = 0;
        if (this->IsJavascriptFrame())
        {
            if (this->interpreterFrame)
            {
                if (this->TryGetByteCodeOffsetFromInterpreterFrame(offset))
                {
                    return offset;
                }
            }

#if ENABLE_NATIVE_CODEGEN
            if (TryGetByteCodeOffsetFromNativeFrame(offset))
            {
                return offset;
            }
#endif
        }
        return offset;
    }